

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_chunks<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>,write_slot>
          (xr_writer *this,undefined8 *container)

{
  undefined8 *puVar1;
  uint32_t id;
  write_slot local_29;
  
  puVar1 = (undefined8 *)container[1];
  id = 0;
  for (container = (undefined8 *)*container; container != puVar1; container = container + 1) {
    open_chunk(this,id);
    write_slot::operator()(&local_29,(wm_slot_le *)*container,this);
    close_chunk(this);
    id = id + 1;
  }
  return;
}

Assistant:

inline void xr_writer::w_chunks(const T& container, F write)
{
	typename T::const_iterator it = container.begin(), end = container.end();
	for (uint32_t id = 0; it != end; ++it) {
		open_chunk(id++);
		write(*it, *this);
		close_chunk();
	}
}